

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  value_type *columns_00;
  value_type *pvVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  char *local_68;
  byte local_2d;
  uint local_2c;
  int column_n;
  ImGuiColumnsSet *columns;
  int n;
  ImGuiWindowFlags flags;
  char *label_local;
  ImGuiWindow *window_local;
  
  local_2d = 1;
  if ((window->Active & 1U) == 0) {
    local_2d = window->WasActive;
  }
  bVar3 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,(ulong)(local_2d & 1),window);
  if (bVar3) {
    uVar2 = window->Flags;
    NodeDrawList(window,window->DrawList,"DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)",
               (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
               (double)(window->Size).y,(double)(window->SizeContents).x,
               (double)(window->SizeContents).y);
    pcVar7 = "";
    if ((uVar2 & 0x1000000) != 0) {
      pcVar7 = "Child ";
    }
    pcVar6 = "";
    if ((uVar2 & 0x2000000) != 0) {
      pcVar6 = "Tooltip ";
    }
    pcVar8 = "";
    if ((uVar2 & 0x4000000) != 0) {
      pcVar8 = "Popup ";
    }
    pcVar9 = "";
    if ((uVar2 & 0x8000000) != 0) {
      pcVar9 = "Modal ";
    }
    pcVar10 = "";
    if ((uVar2 & 0x10000000) != 0) {
      pcVar10 = "ChildMenu ";
    }
    pcVar4 = "";
    if ((uVar2 & 0x100) != 0) {
      pcVar4 = "NoSavedSettings ";
    }
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)",(ulong)uVar2,pcVar7,pcVar6,pcVar8,pcVar9,pcVar10,
               pcVar4);
    fVar1 = (window->Scroll).x;
    fVar11 = ::GetScrollMaxX(window);
    fVar13 = (window->Scroll).y;
    fVar12 = ::GetScrollMaxY(window);
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)fVar1,(double)fVar11,(double)fVar13,
               (double)fVar12);
    BulletText("Active: %d, WriteAccessed: %d",(ulong)(window->Active & 1),
               (ulong)(window->WriteAccessed & 1));
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
               (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
    if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
      local_68 = "NULL";
    }
    else {
      local_68 = window->NavLastChildNavWindow->Name;
    }
    BulletText("NavLastChildNavWindow: %s",local_68);
    bVar3 = ImRect::IsInverted(window->NavRectRel);
    if (bVar3) {
      BulletText("NavRectRel[0]: <None>");
    }
    else {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)window->NavRectRel[0].Min.x,
                 (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                 (double)window->NavRectRel[0].Max.y);
    }
    if (window->RootWindow != window) {
      NodeWindow(window->RootWindow,"RootWindow");
    }
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      NodeWindow(window->ParentWindow,"ParentWindow");
    }
    if (0 < (window->DC).ChildWindows.Size) {
      NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
    }
    if ((0 < (window->ColumnsStorage).Size) &&
       (bVar3 = TreeNode("Columns","Columns sets (%d)",(ulong)(uint)(window->ColumnsStorage).Size),
       bVar3)) {
      for (columns._0_4_ = 0; (int)columns < (window->ColumnsStorage).Size;
          columns._0_4_ = (int)columns + 1) {
        columns_00 = ImVector<ImGuiColumnsSet>::operator[](&window->ColumnsStorage,(int)columns);
        bVar3 = TreeNode((void *)(ulong)columns_00->ID,
                         "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",(ulong)columns_00->ID,
                         (ulong)(uint)columns_00->Count,(ulong)(uint)columns_00->Flags);
        if (bVar3) {
          BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                     (double)(columns_00->MaxX - columns_00->MinX),(double)columns_00->MinX,
                     (double)columns_00->MaxX);
          for (local_2c = 0; (int)local_2c < (columns_00->Columns).Size; local_2c = local_2c + 1) {
            pvVar5 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_2c);
            fVar1 = pvVar5->OffsetNorm;
            pvVar5 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_2c);
            fVar13 = OffsetNormToPixels(columns_00,pvVar5->OffsetNorm);
            BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar1,(double)fVar13,
                       (ulong)local_2c);
          }
          TreePop();
        }
      }
      TreePop();
    }
    BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
    TreePop();
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
            {
                if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                    return;
                ImGuiWindowFlags flags = window->Flags;
                NodeDrawList(window, window->DrawList, "DrawList");
                ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
                ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)", flags,
                    (flags & ImGuiWindowFlags_ChildWindow) ? "Child " : "", (flags & ImGuiWindowFlags_Tooltip)   ? "Tooltip "   : "", (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                    (flags & ImGuiWindowFlags_Modal)       ? "Modal " : "", (flags & ImGuiWindowFlags_ChildMenu) ? "ChildMenu " : "", (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "");
                ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetScrollMaxX(window), window->Scroll.y, GetScrollMaxY(window));
                ImGui::BulletText("Active: %d, WriteAccessed: %d", window->Active, window->WriteAccessed);
                ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
                ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
                if (!window->NavRectRel[0].IsInverted())
                    ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
                else
                    ImGui::BulletText("NavRectRel[0]: <None>");
                if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
                if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
                if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
                if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
                {
                    for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    {
                        const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                        if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                        {
                            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
                ImGui::TreePop();
            }